

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask3_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  uVar1 = in[10];
  uVar2 = in[0xb];
  uVar3 = in[0xd];
  uVar4 = in[0xc];
  *out = uVar1 << 0x1e | in[9] << 0x1b | in[8] << 0x18 | in[7] << 0x15 |
         in[6] << 0x12 | in[5] << 0xf | in[4] << 0xc | in[3] << 9 | in[2] << 6 | in[1] << 3 | *in;
  out[1] = in[0xf] << 0xd | in[0xe] << 10 | uVar3 << 7 | uVar4 << 4 | uVar2 * 2 | uVar1 >> 2;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask3_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 27;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (3 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 13;
  ++in;

  return out + 1;
}